

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

D_Scope * equiv_D_Scope(D_Scope *current)

{
  D_Scope *pDVar1;
  D_Scope *pDVar2;
  D_Sym *pDVar3;
  D_Scope *pDVar4;
  D_Scope *s;
  
  if (current == (D_Scope *)0x0) {
    return (D_Scope *)0x0;
  }
  pDVar2 = current;
  pDVar4 = current;
  do {
    if (pDVar4->depth < current->depth) {
      return pDVar2;
    }
    pDVar1 = pDVar2;
    if ((pDVar4->depth == pDVar2->depth) && (pDVar1 = pDVar4, current->up != pDVar4->up)) {
      return pDVar2;
    }
    pDVar2 = pDVar1;
    if (((pDVar4->ll != (D_Sym *)0x0) || (pDVar4->hash != (D_SymHash *)0x0)) ||
       (pDVar4->dynamic != (D_Scope *)0x0)) {
      return pDVar2;
    }
    for (pDVar3 = pDVar4->updates; pDVar3 != (D_Sym *)0x0; pDVar3 = pDVar3->next) {
      if (pDVar3->scope->depth <= current->depth) {
        return pDVar2;
      }
    }
    pDVar4 = pDVar4->up_updates;
  } while (pDVar4 != (D_Scope *)0x0);
  return pDVar2;
}

Assistant:

D_Scope *equiv_D_Scope(D_Scope *current) {
  D_Scope *s = current, *last = current;
  D_Sym *sy;
  if (!s) return s;
  while (s->depth >= current->depth) {
    if (s->depth == last->depth) {
      if (current->up == s->up)
        last = s;
      else
        break;
    }
    if (s->ll || s->hash) break;
    if (s->dynamic) break;
    sy = s->updates;
    while (sy) {
      if (sy->scope->depth <= current->depth) break;
      sy = sy->next;
    }
    if (sy) break;
    if (!s->up_updates) break;
    s = s->up_updates;
  }
  return last;
}